

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidatePrimitiveIdAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
  *this_00;
  _Rb_tree_color execution_model;
  bool bVar1;
  StorageClass SVar2;
  _Rb_tree_node_base *p_Var3;
  list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
  *plVar4;
  undefined8 *puVar5;
  spv_result_t sVar6;
  undefined1 *puVar7;
  _Any_data local_250;
  code *local_240;
  code *local_238;
  string local_230;
  Instruction *local_210;
  undefined1 local_208 [16];
  _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
  local_1f8;
  BuiltInsValidator *local_c0;
  _Head_base<2UL,_const_char_*,_false> local_b8;
  _Head_base<1UL,_int,_false> local_b0;
  _Head_base<0UL,_spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_false> local_a8;
  spv_result_t local_38;
  
  local_210 = referenced_inst;
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    SVar2 = GetStorageClass((anon_unknown_0 *)
                            (referenced_from_inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (Instruction *)(ulong)(referenced_from_inst->inst_).opcode);
    if (SVar2 != Input) {
      if (SVar2 == Output) {
        if (this->function_id_ != 0) {
          __assert_fail("function_id_ == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_builtins.cpp"
                        ,0x885,
                        "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidatePrimitiveIdAtReference(const Decoration &, const Instruction &, const Instruction &, const Instruction &)"
                       );
        }
        this_00 = &this->id_to_at_reference_checks_;
        local_230._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
        plVar4 = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](this_00,(key_type *)&local_230);
        local_208._0_8_ = ValidateNotCalledWithExecutionModel;
        local_208._8_8_ = 0;
        std::
        _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        ::_Tuple_impl((_Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                       *)&local_1f8,decoration,built_in_inst,referenced_from_inst,
                      (_Placeholder<1> *)&std::placeholders::_1);
        local_c0 = (BuiltInsValidator *)CONCAT44(local_c0._4_4_,ExecutionModelTessellationControl);
        local_b8._M_head_impl =
             "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is TessellationControl."
        ;
        local_b0._M_head_impl = 0x10ee;
        local_a8._M_head_impl = this;
        std::function<spv_result_t(spvtools::val::Instruction_const&)>::
        function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                  ((function<spv_result_t(spvtools::val::Instruction_const&)> *)
                   local_250._M_pod_data,
                   (_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
                    *)local_208);
        std::__cxx11::
        list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
        ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
                  (plVar4,(iterator)plVar4,
                   (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_250);
        if (local_240 != (code *)0x0) {
          (*local_240)(&local_250,&local_250,3);
        }
        if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                          _M_head_impl.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_230._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
        plVar4 = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](this_00,(key_type *)&local_230);
        local_208._0_8_ = ValidateNotCalledWithExecutionModel;
        local_208._8_8_ = 0;
        std::
        _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        ::_Tuple_impl((_Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                       *)&local_1f8,decoration,built_in_inst,referenced_from_inst,
                      (_Placeholder<1> *)&std::placeholders::_1);
        local_c0 = (BuiltInsValidator *)
                   CONCAT44(local_c0._4_4_,ExecutionModelTessellationEvaluation);
        local_b8._M_head_impl =
             "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is TessellationEvaluation."
        ;
        local_b0._M_head_impl = 0x10ee;
        local_a8._M_head_impl = this;
        std::function<spv_result_t(spvtools::val::Instruction_const&)>::
        function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                  ((function<spv_result_t(spvtools::val::Instruction_const&)> *)
                   local_250._M_pod_data,
                   (_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
                    *)local_208);
        std::__cxx11::
        list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
        ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
                  (plVar4,(iterator)plVar4,
                   (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_250);
        if (local_240 != (code *)0x0) {
          (*local_240)(&local_250,&local_250,3);
        }
        if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                          _M_head_impl.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_230._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
        plVar4 = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](this_00,(key_type *)&local_230);
        local_208._0_8_ = ValidateNotCalledWithExecutionModel;
        local_208._8_8_ = 0;
        std::
        _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        ::_Tuple_impl((_Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                       *)&local_1f8,decoration,built_in_inst,referenced_from_inst,
                      (_Placeholder<1> *)&std::placeholders::_1);
        local_c0 = (BuiltInsValidator *)CONCAT44(local_c0._4_4_,ExecutionModelFragment);
        local_b8._M_head_impl =
             "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is Fragment."
        ;
        local_b0._M_head_impl = 0x10ee;
        local_a8._M_head_impl = this;
        std::function<spv_result_t(spvtools::val::Instruction_const&)>::
        function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                  ((function<spv_result_t(spvtools::val::Instruction_const&)> *)
                   local_250._M_pod_data,
                   (_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
                    *)local_208);
        std::__cxx11::
        list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
        ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
                  (plVar4,(iterator)plVar4,
                   (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_250);
        if (local_240 != (code *)0x0) {
          (*local_240)(&local_250,&local_250,3);
        }
        if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                          _M_head_impl.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_230._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
        plVar4 = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](this_00,(key_type *)&local_230);
        local_208._0_8_ = ValidateNotCalledWithExecutionModel;
        local_208._8_8_ = 0;
        std::
        _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        ::_Tuple_impl((_Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                       *)&local_1f8,decoration,built_in_inst,referenced_from_inst,
                      (_Placeholder<1> *)&std::placeholders::_1);
        local_c0 = (BuiltInsValidator *)CONCAT44(local_c0._4_4_,ExecutionModelIntersectionKHR);
        local_b8._M_head_impl =
             "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is IntersectionKHR."
        ;
        local_b0._M_head_impl = 0x10ee;
        local_a8._M_head_impl = this;
        std::function<spv_result_t(spvtools::val::Instruction_const&)>::
        function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                  ((function<spv_result_t(spvtools::val::Instruction_const&)> *)
                   local_250._M_pod_data,
                   (_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
                    *)local_208);
        std::__cxx11::
        list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
        ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
                  (plVar4,(iterator)plVar4,
                   (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_250);
        if (local_240 != (code *)0x0) {
          (*local_240)(&local_250,&local_250,3);
        }
        if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                          _M_head_impl.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_230._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
        plVar4 = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](this_00,(key_type *)&local_230);
        local_208._0_8_ = ValidateNotCalledWithExecutionModel;
        local_208._8_8_ = 0;
        std::
        _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        ::_Tuple_impl((_Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                       *)&local_1f8,decoration,built_in_inst,referenced_from_inst,
                      (_Placeholder<1> *)&std::placeholders::_1);
        local_c0 = (BuiltInsValidator *)CONCAT44(local_c0._4_4_,AnyHitKHR);
        local_b8._M_head_impl =
             "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is AnyHitKHR."
        ;
        local_b0._M_head_impl = 0x10ee;
        local_a8._M_head_impl = this;
        std::function<spv_result_t(spvtools::val::Instruction_const&)>::
        function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                  ((function<spv_result_t(spvtools::val::Instruction_const&)> *)
                   local_250._M_pod_data,
                   (_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
                    *)local_208);
        std::__cxx11::
        list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
        ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
                  (plVar4,(iterator)plVar4,
                   (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_250);
        if (local_240 != (code *)0x0) {
          (*local_240)(&local_250,&local_250,3);
        }
        if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                          _M_head_impl.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_230._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
        plVar4 = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](this_00,(key_type *)&local_230);
        local_208._0_8_ = ValidateNotCalledWithExecutionModel;
        local_208._8_8_ = 0;
        std::
        _Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        ::_Tuple_impl((_Tuple_impl<4UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                       *)&local_1f8,decoration,built_in_inst,referenced_from_inst,
                      (_Placeholder<1> *)&std::placeholders::_1);
        local_c0 = (BuiltInsValidator *)CONCAT44(local_c0._4_4_,ClosestHitKHR);
        local_b8._M_head_impl =
             "Vulkan spec doesn\'t allow BuiltIn PrimitiveId to be used for variables with Output storage class if execution model is ClosestHitKHR."
        ;
        local_b0._M_head_impl = 0x10ee;
        local_a8._M_head_impl = this;
        std::function<spv_result_t(spvtools::val::Instruction_const&)>::
        function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                  ((function<spv_result_t(spvtools::val::Instruction_const&)> *)
                   local_250._M_pod_data,
                   (_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
                    *)local_208);
        std::__cxx11::
        list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
        ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
                  (plVar4,(iterator)plVar4,
                   (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_250);
        if (local_240 != (code *)0x0) {
          (*local_240)(&local_250,&local_250,3);
        }
        if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                          _M_head_impl.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                                _M_head_impl.params_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<2UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.uses_.
                                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.operands_.
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.
            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
            .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
            super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .
                                super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                                .super__Head_base<3UL,_spvtools::val::Instruction,_false>.
                                _M_head_impl.words_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else if (SVar2 != Max) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "Vulkan spec allows BuiltIn PrimitiveId to be only used for variables with Input or Output storage class. "
                   ,0x69);
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  ((string *)&local_250,this,decoration,built_in_inst,local_210,referenced_from_inst
                   ,ExecutionModelMax);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_250._M_unused._0_8_,local_250._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," ",1);
        (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                  (&local_230,this,referenced_from_inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_230._M_dataplus._M_p._4_4_,
                                    (uint32_t)local_230._M_dataplus._M_p),local_230._M_string_length
                  );
        puVar7 = (undefined1 *)
                 CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint32_t)local_230._M_dataplus._M_p);
        sVar6 = local_38;
LAB_0014adc4:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7 != &local_230.field_2) {
          operator_delete(puVar7,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((code **)local_250._M_unused._0_8_ != &local_240) {
          operator_delete(local_250._M_unused._M_object,(ulong)(local_240 + 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        return sVar6;
      }
    }
    for (p_Var3 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      execution_model = p_Var3[1]._M_color;
      if ((3 < execution_model - _S_black) &&
         (((0x33 < execution_model - 0x14c2 ||
           ((0x8000000000007U >> ((ulong)(execution_model - 0x14c2) & 0x3f) & 1) == 0)) &&
          (execution_model != 0x1494)))) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst
                  );
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_250,this->_,0x10ea,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_250._M_unused._0_8_,local_250._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "Vulkan spec allows BuiltIn PrimitiveId to be used only with Fragment, TessellationControl, TessellationEvaluation, Geometry, MeshNV, MeshEXT, IntersectionKHR, AnyHitKHR, and ClosestHitKHR execution models. "
                   ,0xce);
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_230,this,decoration,built_in_inst,local_210,referenced_from_inst,
                   execution_model);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_230._M_dataplus._M_p._4_4_,
                                    (uint32_t)local_230._M_dataplus._M_p),local_230._M_string_length
                  );
        puVar7 = (undefined1 *)
                 CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint32_t)local_230._M_dataplus._M_p);
        sVar6 = local_38;
        goto LAB_0014adc4;
      }
    }
  }
  if (this->function_id_ == 0) {
    local_230._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
    plVar4 = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
              *)std::
                map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                ::operator[](&this->id_to_at_reference_checks_,(key_type *)&local_230);
    local_208._0_8_ = ValidatePrimitiveIdAtReference;
    local_208._8_8_ = 0;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl(&local_1f8,decoration,built_in_inst,referenced_from_inst,
                  (_Placeholder<1> *)&std::placeholders::_1);
    local_250._8_8_ = 0;
    local_c0 = this;
    puVar5 = (undefined8 *)operator_new(0x150);
    *puVar5 = local_208._0_8_;
    puVar5[1] = local_208._8_8_;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                   *)(puVar5 + 2),&local_1f8);
    puVar5[0x29] = local_c0;
    local_238 = std::
                _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                ::_M_invoke;
    local_240 = std::
                _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                ::_M_manager;
    local_250._M_unused._M_object = puVar5;
    std::__cxx11::
    list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
    ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
              (plVar4,(iterator)plVar4,
               (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_250);
    if (local_240 != (code *)0x0) {
      (*local_240)(&local_250,&local_250,3);
    }
    if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl
                      .params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidatePrimitiveIdAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input &&
        storage_class != spv::StorageClass::Output) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << "Vulkan spec allows BuiltIn PrimitiveId to be only used for "
                "variables with Input or Output storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    if (storage_class == spv::StorageClass::Output) {
      assert(function_id_ == 0);
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "TessellationControl.",
          spv::ExecutionModel::TessellationControl, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "TessellationEvaluation.",
          spv::ExecutionModel::TessellationEvaluation, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "Fragment.",
          spv::ExecutionModel::Fragment, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "IntersectionKHR.",
          spv::ExecutionModel::IntersectionKHR, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "AnyHitKHR.",
          spv::ExecutionModel::AnyHitKHR, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
      id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
          &BuiltInsValidator::ValidateNotCalledWithExecutionModel, this, 4334,
          "Vulkan spec doesn't allow BuiltIn PrimitiveId to be used for "
          "variables with Output storage class if execution model is "
          "ClosestHitKHR.",
          spv::ExecutionModel::ClosestHitKHR, decoration, built_in_inst,
          referenced_from_inst, std::placeholders::_1));
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      switch (execution_model) {
        case spv::ExecutionModel::Fragment:
        case spv::ExecutionModel::TessellationControl:
        case spv::ExecutionModel::TessellationEvaluation:
        case spv::ExecutionModel::Geometry:
        case spv::ExecutionModel::MeshNV:
        case spv::ExecutionModel::MeshEXT:
        case spv::ExecutionModel::IntersectionKHR:
        case spv::ExecutionModel::AnyHitKHR:
        case spv::ExecutionModel::ClosestHitKHR: {
          // Ok.
          break;
        }

        default: {
          return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
                 << _.VkErrorID(4330)
                 << "Vulkan spec allows BuiltIn PrimitiveId to be used only "
                    "with Fragment, TessellationControl, "
                    "TessellationEvaluation, Geometry, MeshNV, MeshEXT, "
                    "IntersectionKHR, AnyHitKHR, and ClosestHitKHR execution models. "
                 << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                     referenced_from_inst, execution_model);
        }
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidatePrimitiveIdAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}